

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.hpp
# Opt level: O1

void __thiscall
Indexing::AlascaIndex<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handleClause
          (AlascaIndex<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this,Clause *c,bool adding)

{
  long *plVar1;
  GenSubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *pGVar2;
  StlIter __begin0;
  Elem appl;
  OptionBase<Inferences::ALASCA::FourierMotzkinConf::Lhs> local_270;
  Lhs local_238;
  Lhs local_208;
  Lhs local_1d8;
  OptionBase<Inferences::ALASCA::FourierMotzkinConf::Lhs> local_1a8;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:344:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_FourierMotzkin_hpp:59:23),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_FourierMotzkin_hpp:60:23),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_FourierMotzkin_hpp:61:20),_Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
  local_170;
  
  Inferences::ALASCA::FourierMotzkinConf::Lhs::iter
            (&local_170,
             (this->_shared).super___shared_ptr<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,c);
  ::Lib::
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:344:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/FourierMotzkin.hpp:59:23),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/FourierMotzkin.hpp:60:23),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/FourierMotzkin.hpp:61:20),_Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
  ::tryNext((Option<Inferences::ALASCA::FourierMotzkinConf::Lhs> *)&local_270,&local_170);
  if (local_270._isSome == true) {
    pGVar2 = &this->_index;
    do {
      Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs(&local_1d8,(Lhs *)&local_270._elem);
      if (adding) {
        Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs(&local_208,&local_1d8);
        Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs((Lhs *)&local_1a8,&local_208);
        (*(pGVar2->super_TermIndexingStructure<Inferences::ALASCA::FourierMotzkinConf::Lhs>).
          _vptr_TermIndexingStructure[2])(pGVar2,&local_1a8,1);
      }
      else {
        Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs(&local_238,&local_1d8);
        Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs((Lhs *)&local_1a8,&local_238);
        (*(pGVar2->super_TermIndexingStructure<Inferences::ALASCA::FourierMotzkinConf::Lhs>).
          _vptr_TermIndexingStructure[2])(pGVar2,&local_1a8,0);
      }
      ::Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:344:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/FourierMotzkin.hpp:59:23),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/FourierMotzkin.hpp:60:23),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/FourierMotzkin.hpp:61:20),_Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
      ::tryNext((Option<Inferences::ALASCA::FourierMotzkinConf::Lhs> *)&local_1a8,&local_170);
      ::Lib::OptionBase<Inferences::ALASCA::FourierMotzkinConf::Lhs>::operator=
                (&local_270,&local_1a8);
    } while (local_270._isSome != false);
  }
  if ((local_170._iter._inner._inn._inn._inn._current.
       super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
       ._isSome == true) &&
     (local_170._iter._inner._inn._inn._inn._current.
      super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar1 = (long *)((long)local_170._iter._inner._inn._inn._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_170._iter._inner._inn._inn._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8))();
    }
  }
  if (local_170._iter._inner._inn._inn._inn._master._inner._inner._func.cmp.cmpCache.
      super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170._iter._inner._inn._inn._inn._master._inner._inner._func.cmp.cmpCache.
               super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

virtual void handleClause(Clause* c, bool adding) final override
  {
    TIME_TRACE(_maintainanceStr.c_str())
    for (auto appl : T::iter(*_shared, c)) {
      if (adding) {
#if VDEBUG
        auto k = appl.key();
#endif
        _index.insert(std::move(appl));
        DEBUG_CODE(
        auto state = AbstractingUnifier::empty(AbstractionOracle(Shell::Options::UnificationWithAbstraction::OFF));
        )
        ASS_REP(find<RetrievalAlgorithms::DefaultVarBanks>(&state, k).hasNext(), Output::cat("key: ", Output::ptr(k), "\nindex: ", Output::multiline(_index)))
      } else {
        _index.remove(std::move(appl));
      }
    }
  }